

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqpvalue.c
# Opt level: O0

int amqpvalue_get_map(AMQP_VALUE value,AMQP_VALUE *map_value)

{
  LOGGER_LOG p_Var1;
  LOGGER_LOG l_1;
  AMQP_VALUE_DATA *value_data;
  LOGGER_LOG l;
  int result;
  AMQP_VALUE *map_value_local;
  AMQP_VALUE value_local;
  
  if ((value == (AMQP_VALUE)0x0) || (map_value == (AMQP_VALUE *)0x0)) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/amqpvalue.c"
                ,"amqpvalue_get_map",0x710,1,"Bad arguments: value = %p, map_value = %p",value,
                map_value);
    }
    l._4_4_ = 0x711;
  }
  else if (value->type == AMQP_TYPE_MAP) {
    *map_value = value;
    l._4_4_ = 0;
  }
  else {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/amqpvalue.c"
                ,"amqpvalue_get_map",0x718,1,"Value is not of type MAP");
    }
    l._4_4_ = 0x719;
  }
  return l._4_4_;
}

Assistant:

int amqpvalue_get_map(AMQP_VALUE value, AMQP_VALUE* map_value)
{
    int result;

    if ((value == NULL) ||
        (map_value == NULL))
    {
        LogError("Bad arguments: value = %p, map_value = %p",
            value, map_value);
        result = MU_FAILURE;
    }
    else
    {
        AMQP_VALUE_DATA* value_data = (AMQP_VALUE_DATA*)value;
        if (value_data->type != AMQP_TYPE_MAP)
        {
            LogError("Value is not of type MAP");
            result = MU_FAILURE;
        }
        else
        {
            *map_value = value;
            result = 0;
        }
    }

    return result;
}